

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O0

TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_> * __thiscall
TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstruct<float>_>::PopItem
          (TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstruct<float>_> *this)

{
  size_type sVar1;
  TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_> *in_RDI;
  lock_guard<std::mutex> lock;
  TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_> *result;
  TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_> *in_stack_ffffffffffffffa8;
  TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_> *this_00;
  TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_> *in_stack_ffffffffffffffd0;
  
  this_00 = in_RDI;
  TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>::TPZDohrPrecondV2SubData
            (in_stack_ffffffffffffffd0);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)this_00,(mutex_type *)in_stack_ffffffffffffffa8);
  sVar1 = std::__cxx11::
          list<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>,_std::allocator<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>_>_>
          ::size((list<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>,_std::allocator<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>_>_>
                  *)this_00);
  if (sVar1 != 0) {
    std::__cxx11::
    list<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>,_std::allocator<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>_>_>
    ::begin((list<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>,_std::allocator<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>_>_>
             *)in_stack_ffffffffffffffa8);
    std::_List_iterator<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>_>::operator*
              ((_List_iterator<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>_> *)
               0x1f90a81);
    TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>::operator=
              (this_00,in_stack_ffffffffffffffa8);
    std::__cxx11::
    list<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>,_std::allocator<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>_>_>
    ::pop_front((list<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>,_std::allocator<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>_>_>
                 *)this_00);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f90ad9);
  return in_RDI;
}

Assistant:

TPZDohrPrecondV2SubData<TVar, TSubStruct> PopItem()
	{
		TPZDohrPrecondV2SubData<TVar, TSubStruct> result;
        std::lock_guard<std::mutex> lock(fAccessLock);
		if (fWork.size()) {
			result = *fWork.begin();
			fWork.pop_front();
		}
		return result;
	}